

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugLoc::parse(DWARFDebugLoc *this,DWARFDataExtractor *data)

{
  Twine ErrorBanner;
  uint64_t uVar1;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  reference Elt;
  raw_ostream *OS;
  int local_d4;
  Child local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined1 local_b8 [24];
  undefined1 local_a0 [8];
  Expected<llvm::DWARFDebugLoc::LocationList> LL;
  uint64_t local_20;
  uint64_t Offset;
  DWARFDataExtractor *data_local;
  DWARFDebugLoc *this_local;
  
  Offset = (uint64_t)data;
  data_local = (DWARFDataExtractor *)this;
  bVar2 = DataExtractor::isLittleEndian(&data->super_DataExtractor);
  this->IsLittleEndian = bVar2;
  bVar3 = DataExtractor::getAddressSize((DataExtractor *)Offset);
  this->AddressSize = (uint)bVar3;
  local_20 = 0;
  do {
    uVar1 = local_20;
    join_0x00000010_0x00000000_ = DataExtractor::getData((DataExtractor *)Offset);
    sVar4 = StringRef::size((StringRef *)&LL.field_0x68);
    if (sVar4 <= uVar1) {
      return;
    }
    parseOneLocationList
              ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_a0,this,
               (DWARFDataExtractor *)Offset,&local_20);
    bVar2 = llvm::Expected::operator_cast_to_bool((Expected *)local_a0);
    if (bVar2) {
      Elt = Expected<llvm::DWARFDebugLoc::LocationList>::operator*
                      ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_a0);
      SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)this,Elt);
      local_d4 = 0;
    }
    else {
      Expected<llvm::DWARFDebugLoc::LocationList>::takeError
                ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_b8);
      OS = WithColor::error();
      Twine::Twine((Twine *)&local_d0);
      ErrorBanner.RHS = (Child)uStack_c8;
      ErrorBanner.LHS.twine = local_d0.twine;
      ErrorBanner.LHSKind = (undefined1)local_c0;
      ErrorBanner.RHSKind = local_c0._1_1_;
      ErrorBanner._18_6_ = local_c0._2_6_;
      logAllUnhandledErrors((Error *)local_b8,OS,ErrorBanner);
      Error::~Error((Error *)local_b8);
      local_d4 = 3;
    }
    Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
              ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_a0);
  } while (local_d4 == 0);
  return;
}

Assistant:

void DWARFDebugLoc::parse(const DWARFDataExtractor &data) {
  IsLittleEndian = data.isLittleEndian();
  AddressSize = data.getAddressSize();

  uint64_t Offset = 0;
  while (Offset < data.getData().size()) {
    if (auto LL = parseOneLocationList(data, &Offset))
      Locations.push_back(std::move(*LL));
    else {
      logAllUnhandledErrors(LL.takeError(), WithColor::error());
      break;
    }
  }
}